

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  bool bVar1;
  reference pSVar2;
  undefined1 local_30 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
  local_28;
  const_reverse_iterator itEnd;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
  local_18;
  const_reverse_iterator it;
  RunContext *this_local;
  
  it.current._M_current =
       (__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>
        )(__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>
          )this;
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rbegin
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)&itEnd);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_const*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_const*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
              *)&local_18,
             (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
              *)&itEnd);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rend
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)local_30);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_const*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_const*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
              *)&local_28,
             (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
              *)local_30);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    pSVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
             ::operator*(&local_18);
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])(this,pSVar2);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
    ::operator++(&local_18);
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::clear
            (&this->m_unfinishedSections);
  return;
}

Assistant:

void handleUnfinishedSections() {
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<SectionEndInfo>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( *it );
            m_unfinishedSections.clear();
        }